

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O3

token __thiscall
wigwag::
signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
::connect<std::function<void()>>
          (signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
           *this,function<void_()> *handler,handler_attributes attributes)

{
  code *pcVar1;
  long *plVar2;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 local_30;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,attributes);
  plVar2 = *(long **)&(handler->super__Function_base)._M_functor;
  if (plVar2 == (long *)0x0) {
    plVar2 = (long *)operator_new(0x28);
    *(undefined4 *)(plVar2 + 2) = 1;
    plVar2[3] = (long)(plVar2 + 3);
    plVar2[4] = (long)(plVar2 + 3);
    *plVar2 = (long)&PTR__signal_impl_00214dd0;
    plVar2[1] = (long)&PTR__signal_impl_00214e18;
    *(long **)&(handler->super__Function_base)._M_functor = plVar2;
  }
  local_48 = 0;
  uStack_40 = 0;
  local_38 = (code *)0x0;
  local_30 = puVar3[3];
  pcVar1 = (code *)puVar3[2];
  if (pcVar1 != (code *)0x0) {
    local_48 = *puVar3;
    uStack_40 = puVar3[1];
    puVar3[2] = 0;
    puVar3[3] = 0;
    local_38 = pcVar1;
  }
  (**(code **)(*plVar2 + 0x10))(this,plVar2,&local_48,in_ECX);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (token)(implementation *)this;
}

Assistant:

token connect(HandlerFunc_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }